

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O3

error_code __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::
set_option<asio::detail::socket_option::linger<1,13>>
          (reactive_socket_service<asio::ip::tcp> *this,implementation_type *impl,
          linger<1,_13> *option,error_code *ec)

{
  state_type *psVar1;
  int iVar2;
  uint *puVar3;
  uint uVar4;
  error_code eVar5;
  
  iVar2 = (impl->super_base_implementation_type).socket_;
  if (iVar2 == -1) {
    std::error_code::operator=(ec,bad_descriptor);
    uVar4 = ec->_M_value;
  }
  else {
    psVar1 = &(impl->super_base_implementation_type).state_;
    *psVar1 = *psVar1 | 8;
    iVar2 = setsockopt(iVar2,1,0xd,option,8);
    if (iVar2 == 0) {
      ec->_M_value = 0;
      uVar4 = 0;
    }
    else {
      puVar3 = (uint *)__errno_location();
      uVar4 = *puVar3;
      if (system_category()::instance == '\0') {
        set_option<asio::detail::socket_option::linger<1,13>>();
      }
      ec->_M_value = uVar4;
      ec->_M_cat = (error_category *)&system_category()::instance;
    }
  }
  eVar5._4_4_ = 0;
  eVar5._M_value = uVar4;
  eVar5._M_cat = ec->_M_cat;
  return eVar5;
}

Assistant:

asio::error_code set_option(implementation_type& impl,
      const Option& option, asio::error_code& ec)
  {
    socket_ops::setsockopt(impl.socket_, impl.state_,
        option.level(impl.protocol_), option.name(impl.protocol_),
        option.data(impl.protocol_), option.size(impl.protocol_), ec);

    ASIO_ERROR_LOCATION(ec);
    return ec;
  }